

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O3

_Bool gen_branch(DisasContext_conflict12 *ctx,arg_b *a,TCGCond cond)

{
  TCGContext_conflict11 *s;
  target_ulong tVar1;
  undefined1 extraout_AL;
  TCGLabel *l;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i64 pTVar2;
  TCGv_i64 a2;
  uintptr_t o_3;
  TCGOpcode TVar3;
  uintptr_t o_2;
  TCGv_i64 arg1;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_riscv64(s);
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  arg1 = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    TVar3 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_00c6dbfb:
    tcg_gen_op2_riscv64(s,TVar3,(TCGArg)a1,(TCGArg)pTVar2);
  }
  else if (s->cpu_gpr[a->rs1] != arg1) {
    pTVar2 = s->cpu_gpr[a->rs1] + (long)s;
    TVar3 = INDEX_op_mov_i64;
    goto LAB_00c6dbfb;
  }
  pTVar2 = (TCGv_i64)((long)a1_00 - (long)s);
  if ((long)a->rs2 == 0) {
    TVar3 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs2] == pTVar2) goto LAB_00c6dc43;
    a2 = s->cpu_gpr[a->rs2] + (long)s;
    TVar3 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,TVar3,(TCGArg)a1_00,(TCGArg)a2);
LAB_00c6dc43:
  tcg_gen_brcond_i64_riscv64(s,cond,arg1,pTVar2,l);
  gen_goto_tb(ctx,1,ctx->pc_succ_insn);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_riscv64(s,INDEX_op_set_label,(TCGArg)l);
  tVar1 = (ctx->base).pc_next;
  if (((ctx->misa & 4) == 0) && (((int)tVar1 + a->imm & 3U) != 0)) {
    gen_exception_inst_addr_mis(ctx);
  }
  else {
    gen_goto_tb(ctx,0,tVar1 + (long)a->imm);
  }
  (ctx->base).is_jmp = DISAS_NORETURN;
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(arg1 + (long)s));
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar2 + (long)s));
  return (_Bool)extraout_AL;
}

Assistant:

static bool gen_branch(DisasContext *ctx, arg_b *a, TCGCond cond)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l = gen_new_label(tcg_ctx);
    TCGv source1, source2;
    source1 = tcg_temp_new(tcg_ctx);
    source2 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, source1, a->rs1);
    gen_get_gpr(tcg_ctx, source2, a->rs2);

    tcg_gen_brcond_tl(tcg_ctx, cond, source1, source2, l);
    gen_goto_tb(ctx, 1, ctx->pc_succ_insn);
    gen_set_label(tcg_ctx, l); /* branch taken */

    if (!has_ext(ctx, RVC) && ((ctx->base.pc_next + a->imm) & 0x3)) {
        /* misaligned */
        gen_exception_inst_addr_mis(ctx);
    } else {
        gen_goto_tb(ctx, 0, ctx->base.pc_next + a->imm);
    }
    ctx->base.is_jmp = DISAS_NORETURN;

    tcg_temp_free(tcg_ctx, source1);
    tcg_temp_free(tcg_ctx, source2);

    return true;
}